

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void register_opcode(disas_proc proc,uint16_t opcode,uint16_t mask)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  uint uVar3;
  undefined6 in_register_00000012;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  undefined6 in_register_00000032;
  ulong uVar7;
  long lVar8;
  uint uVar9;
  int iVar12;
  undefined1 auVar11 [16];
  bool bVar13;
  undefined1 auVar14 [16];
  int iVar15;
  ulong uVar10;
  
  auVar2 = _DAT_00d58680;
  auVar1 = _DAT_00d58670;
  uVar5 = (uint)CONCAT62(in_register_00000032,opcode);
  uVar3 = (uint)CONCAT62(in_register_00000012,mask);
  if ((~uVar3 & uVar5) == 0) {
    uVar9 = 0x8000;
    do {
      uVar6 = uVar9;
      uVar9 = uVar6 >> 1;
    } while ((uVar6 & uVar3) != 0);
    iVar12 = 1;
    if (uVar6 != 0) {
      iVar12 = uVar6 * 2;
    }
    if (iVar12 != 0) {
      uVar9 = -iVar12 & uVar5;
      uVar10 = (ulong)uVar9;
      uVar7 = (ulong)(iVar12 + uVar9);
      if ((ulong)(iVar12 + uVar9) < uVar10 + 1) {
        uVar7 = uVar10 + 1;
      }
      lVar8 = (uVar7 - uVar10) + -1;
      auVar11._8_4_ = (int)lVar8;
      auVar11._0_8_ = lVar8;
      auVar11._12_4_ = (int)((ulong)lVar8 >> 0x20);
      uVar4 = 0;
      auVar11 = auVar11 ^ _DAT_00d58680;
      do {
        auVar14._8_4_ = (int)uVar4;
        auVar14._0_8_ = uVar4;
        auVar14._12_4_ = (int)(uVar4 >> 0x20);
        auVar14 = (auVar14 | auVar1) ^ auVar2;
        iVar12 = auVar11._4_4_;
        iVar15 = auVar14._4_4_;
        bVar13 = (bool)(~(iVar12 < iVar15 || iVar15 == iVar12 && auVar11._0_4_ < auVar14._0_4_) &
                       (uVar9 & uVar3) == uVar5);
        if (bVar13) {
          opcode_table[uVar10 + uVar4] = proc;
        }
        if (bVar13 != false) {
          *(disas_proc *)(uVar10 * 8 + 0x118fb28 + uVar4 * 8) = proc;
        }
        uVar4 = uVar4 + 2;
        uVar9 = uVar9 + 2;
      } while (((uVar7 - uVar10) + 1 & 0xfffffffffffffffe) != uVar4);
    }
    return;
  }
  fprintf(_stderr,"qemu internal error: bogus opcode definition %04x/%04x\n");
  abort();
}

Assistant:

static void
register_opcode (disas_proc proc, uint16_t opcode, uint16_t mask)
{
  int i;
  int from;
  int to;

  /* Sanity check.  All set bits must be included in the mask.  */
  if (opcode & ~mask) {
      fprintf(stderr,
              "qemu internal error: bogus opcode definition %04x/%04x\n",
              opcode, mask);
      abort();
  }
  /*
   * This could probably be cleverer.  For now just optimize the case where
   * the top bits are known.
   */
  /* Find the first zero bit in the mask.  */
  i = 0x8000;
  while ((i & mask) != 0)
      i >>= 1;
  /* Iterate over all combinations of this and lower bits.  */
  if (i == 0)
      i = 1;
  else
      i <<= 1;
  from = opcode & ~(i - 1);
  to = from + i;
  for (i = from; i < to; i++) {
      if ((i & mask) == opcode)
          opcode_table[i] = proc;
  }
}